

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateFtest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  undefined8 uVar4;
  type_conflict5 tVar5;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar6;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar7;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  ulong uVar9;
  int j;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  theeps;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<100U,_int,_void> local_198;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  cpp_dec_float<100U,_int,_void> local_f8;
  DIdxSet *local_a0;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_98;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_90;
  DIdxSet *local_88;
  multiprecision local_80 [80];
  
  pUVar7 = this->theFvec;
  local_88 = &this->updateViols;
  (this->updateViols).super_IdxSet.num = 0;
  entertol(&local_148,this);
  this_00 = &this->m_pricingViol;
  local_90 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&this->theUBbound;
  local_98 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&this->theLBbound;
  local_a0 = &this->infeasibilities;
  for (uVar9 = (ulong)(uint)(pUVar7->thedelta).super_IdxSet.num; 0 < (int)uVar9; uVar9 = uVar9 - 1)
  {
    iVar2 = (pUVar7->thedelta).super_IdxSet.idx[uVar9 - 1];
    if (this->m_pricingViolUpToDate == true) {
      local_198.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
      local_198.data._M_elems[1] = local_148.m_backend.data._M_elems[1];
      uVar4 = local_198.data._M_elems._0_8_;
      local_198.data._M_elems[2] = local_148.m_backend.data._M_elems[2];
      local_198.data._M_elems[3] = local_148.m_backend.data._M_elems[3];
      local_198.data._M_elems[0xc] = local_148.m_backend.data._M_elems[0xc];
      local_198.data._M_elems[0xd] = local_148.m_backend.data._M_elems[0xd];
      local_198.data._M_elems._56_5_ = local_148.m_backend.data._M_elems._56_5_;
      local_198.data._M_elems[0xf]._1_3_ = local_148.m_backend.data._M_elems[0xf]._1_3_;
      local_198.data._M_elems[8] = local_148.m_backend.data._M_elems[8];
      local_198.data._M_elems[9] = local_148.m_backend.data._M_elems[9];
      local_198.data._M_elems[10] = local_148.m_backend.data._M_elems[10];
      local_198.data._M_elems[0xb] = local_148.m_backend.data._M_elems[0xb];
      local_198.data._M_elems[4] = local_148.m_backend.data._M_elems[4];
      local_198.data._M_elems[5] = local_148.m_backend.data._M_elems[5];
      local_198.data._M_elems[6] = local_148.m_backend.data._M_elems[6];
      local_198.data._M_elems[7] = local_148.m_backend.data._M_elems[7];
      local_198.exp = local_148.m_backend.exp;
      local_198.neg = local_148.m_backend.neg;
      local_198.fpclass = local_148.m_backend.fpclass;
      local_198.prec_elem = local_148.m_backend.prec_elem;
      local_198.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
      if (local_148.m_backend.fpclass != cpp_dec_float_finite || local_198.data._M_elems[0] != 0) {
        local_198.neg = (bool)(local_148.m_backend.neg ^ 1);
      }
      local_198.data._M_elems._0_8_ = uVar4;
      tVar5 = boost::multiprecision::operator<
                        ((this->theCoTest).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar2,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_198);
      if (tVar5) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&this_00->m_backend,
                   &(this->theCoTest).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
      }
    }
    tVar5 = boost::multiprecision::operator>
                      ((this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar2,
                       (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar2);
    pUVar6 = this->theFvec;
    pUVar8 = local_90;
    if (!tVar5) {
      pUVar6 = local_98;
      pUVar8 = this->theFvec;
    }
    local_198.fpclass = cpp_dec_float_finite;
    local_198.prec_elem = 0x10;
    local_198.data._M_elems[0xc] = 0;
    local_198.data._M_elems[0xd] = 0;
    local_198.data._M_elems._56_5_ = 0;
    local_198.data._M_elems[8] = 0;
    local_198.data._M_elems[9] = 0;
    local_198.data._M_elems[10] = 0;
    local_198.data._M_elems[0xb] = 0;
    local_198.data._M_elems[4] = 0;
    local_198.data._M_elems[5] = 0;
    local_198.data._M_elems[6] = 0;
    local_198.data._M_elems[7] = 0;
    local_198.data._M_elems[0] = 0;
    local_198.data._M_elems[1] = 0;
    local_198.data._M_elems[2] = 0;
    local_198.data._M_elems[3] = 0;
    local_198.data._M_elems[0xf]._1_3_ = 0;
    local_198.exp = 0;
    local_198.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_198,
               &(pUVar8->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend,
               &(pUVar6->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
    pnVar3 = (this->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x30);
    *(undefined8 *)puVar1 = local_198.data._M_elems._48_8_;
    *(ulong *)(puVar1 + 2) =
         CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
    puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x20);
    *(undefined8 *)puVar1 = local_198.data._M_elems._32_8_;
    *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._40_8_;
    puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = local_198.data._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._24_8_;
    *(undefined8 *)&pnVar3[iVar2].m_backend.data = local_198.data._M_elems._0_8_;
    *(undefined8 *)((long)&pnVar3[iVar2].m_backend.data + 8) = local_198.data._M_elems._8_8_;
    pnVar3[iVar2].m_backend.exp = local_198.exp;
    pnVar3[iVar2].m_backend.neg = local_198.neg;
    pnVar3[iVar2].m_backend.fpclass = local_198.fpclass;
    pnVar3[iVar2].m_backend.prec_elem = local_198.prec_elem;
    if (this->sparsePricingLeave == true) {
      local_198.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
      local_198.data._M_elems[1] = local_148.m_backend.data._M_elems[1];
      uVar4 = local_198.data._M_elems._0_8_;
      local_198.data._M_elems[2] = local_148.m_backend.data._M_elems[2];
      local_198.data._M_elems[3] = local_148.m_backend.data._M_elems[3];
      local_198.data._M_elems[0xc] = local_148.m_backend.data._M_elems[0xc];
      local_198.data._M_elems[0xd] = local_148.m_backend.data._M_elems[0xd];
      local_198.data._M_elems._56_5_ = local_148.m_backend.data._M_elems._56_5_;
      local_198.data._M_elems[0xf]._1_3_ = local_148.m_backend.data._M_elems[0xf]._1_3_;
      local_198.data._M_elems[8] = local_148.m_backend.data._M_elems[8];
      local_198.data._M_elems[9] = local_148.m_backend.data._M_elems[9];
      local_198.data._M_elems[10] = local_148.m_backend.data._M_elems[10];
      local_198.data._M_elems[0xb] = local_148.m_backend.data._M_elems[0xb];
      local_198.data._M_elems[4] = local_148.m_backend.data._M_elems[4];
      local_198.data._M_elems[5] = local_148.m_backend.data._M_elems[5];
      local_198.data._M_elems[6] = local_148.m_backend.data._M_elems[6];
      local_198.data._M_elems[7] = local_148.m_backend.data._M_elems[7];
      local_198.exp = local_148.m_backend.exp;
      local_198.neg = local_148.m_backend.neg;
      local_198.fpclass = local_148.m_backend.fpclass;
      local_198.prec_elem = local_148.m_backend.prec_elem;
      local_198.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
      if (local_148.m_backend.fpclass != cpp_dec_float_finite || local_198.data._M_elems[0] != 0) {
        local_198.neg = (bool)(local_148.m_backend.neg ^ 1);
      }
      local_198.data._M_elems._0_8_ = uVar4;
      tVar5 = boost::multiprecision::operator<
                        ((this->theCoTest).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar2,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_198);
      if (!tVar5) goto LAB_002ffdf8;
      if (this->m_pricingViolUpToDate == true) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&this_00->m_backend,
                   &(this->theCoTest).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
      }
      if ((this->isInfeasible).data[iVar2] == 0) {
        DIdxSet::addIdx(local_a0,iVar2);
        (this->isInfeasible).data[iVar2] = 1;
      }
      if (this->hyperPricingLeave == true) {
        DIdxSet::addIdx(local_88,iVar2);
      }
    }
    else {
LAB_002ffdf8:
      if (this->m_pricingViolUpToDate == true) {
        local_198.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
        local_198.data._M_elems[1] = local_148.m_backend.data._M_elems[1];
        uVar4 = local_198.data._M_elems._0_8_;
        local_198.data._M_elems[2] = local_148.m_backend.data._M_elems[2];
        local_198.data._M_elems[3] = local_148.m_backend.data._M_elems[3];
        local_198.data._M_elems[0xc] = local_148.m_backend.data._M_elems[0xc];
        local_198.data._M_elems[0xd] = local_148.m_backend.data._M_elems[0xd];
        local_198.data._M_elems._56_5_ = local_148.m_backend.data._M_elems._56_5_;
        local_198.data._M_elems[0xf]._1_3_ = local_148.m_backend.data._M_elems[0xf]._1_3_;
        local_198.data._M_elems[8] = local_148.m_backend.data._M_elems[8];
        local_198.data._M_elems[9] = local_148.m_backend.data._M_elems[9];
        local_198.data._M_elems[10] = local_148.m_backend.data._M_elems[10];
        local_198.data._M_elems[0xb] = local_148.m_backend.data._M_elems[0xb];
        local_198.data._M_elems[4] = local_148.m_backend.data._M_elems[4];
        local_198.data._M_elems[5] = local_148.m_backend.data._M_elems[5];
        local_198.data._M_elems[6] = local_148.m_backend.data._M_elems[6];
        local_198.data._M_elems[7] = local_148.m_backend.data._M_elems[7];
        local_198.exp = local_148.m_backend.exp;
        local_198.neg = local_148.m_backend.neg;
        local_198.fpclass = local_148.m_backend.fpclass;
        local_198.prec_elem = local_148.m_backend.prec_elem;
        local_198.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
        if (local_148.m_backend.fpclass != cpp_dec_float_finite || local_198.data._M_elems[0] != 0)
        {
          local_198.neg = (bool)(local_148.m_backend.neg ^ 1);
        }
        local_198.data._M_elems._0_8_ = uVar4;
        tVar5 = boost::multiprecision::operator<
                          ((this->theCoTest).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar2,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_198);
        if (tVar5) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&this_00->m_backend,
                     &(this->theCoTest).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
        }
      }
    }
  }
  if (0 < this->boundflips) {
    epsilon((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&local_198,this);
    for (lVar10 = 0; lVar10 < (this->solveVector3->super_IdxSet).num; lVar10 = lVar10 + 1) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::value((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_80,this->solveVector3,(int)lVar10);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((type *)&local_f8,local_80,arg);
      tVar5 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_f8,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_198);
      if (tVar5) {
        iVar2 = (this->solveVector3->super_IdxSet).idx[lVar10];
        if (this->m_pricingViolUpToDate == true) {
          local_f8.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
          local_f8.data._M_elems[1] = local_148.m_backend.data._M_elems[1];
          uVar4 = local_f8.data._M_elems._0_8_;
          local_f8.data._M_elems[2] = local_148.m_backend.data._M_elems[2];
          local_f8.data._M_elems[3] = local_148.m_backend.data._M_elems[3];
          local_f8.data._M_elems[0xc] = local_148.m_backend.data._M_elems[0xc];
          local_f8.data._M_elems[0xd] = local_148.m_backend.data._M_elems[0xd];
          local_f8.data._M_elems._56_5_ = local_148.m_backend.data._M_elems._56_5_;
          local_f8.data._M_elems[0xf]._1_3_ = local_148.m_backend.data._M_elems[0xf]._1_3_;
          local_f8.data._M_elems[8] = local_148.m_backend.data._M_elems[8];
          local_f8.data._M_elems[9] = local_148.m_backend.data._M_elems[9];
          local_f8.data._M_elems[10] = local_148.m_backend.data._M_elems[10];
          local_f8.data._M_elems[0xb] = local_148.m_backend.data._M_elems[0xb];
          local_f8.data._M_elems[4] = local_148.m_backend.data._M_elems[4];
          local_f8.data._M_elems[5] = local_148.m_backend.data._M_elems[5];
          local_f8.data._M_elems[6] = local_148.m_backend.data._M_elems[6];
          local_f8.data._M_elems[7] = local_148.m_backend.data._M_elems[7];
          local_f8.exp = local_148.m_backend.exp;
          local_f8.neg = local_148.m_backend.neg;
          local_f8.fpclass = local_148.m_backend.fpclass;
          local_f8.prec_elem = local_148.m_backend.prec_elem;
          local_f8.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
          if (local_148.m_backend.fpclass != cpp_dec_float_finite || local_f8.data._M_elems[0] != 0)
          {
            local_f8.neg = (bool)(local_148.m_backend.neg ^ 1);
          }
          local_f8.data._M_elems._0_8_ = uVar4;
          tVar5 = boost::multiprecision::operator<
                            ((this->theCoTest).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar2,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_f8);
          if (tVar5) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&this_00->m_backend,
                       &(this->theCoTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
          }
        }
        tVar5 = boost::multiprecision::operator>
                          ((this->theFvec->
                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar2,
                           (this->theUBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar2);
        pUVar7 = this->theFvec;
        pUVar6 = local_90;
        if (!tVar5) {
          pUVar7 = local_98;
          pUVar6 = this->theFvec;
        }
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 0x10;
        local_f8.data._M_elems[0xc] = 0;
        local_f8.data._M_elems[0xd] = 0;
        local_f8.data._M_elems._56_5_ = 0;
        local_f8.data._M_elems[8] = 0;
        local_f8.data._M_elems[9] = 0;
        local_f8.data._M_elems[10] = 0;
        local_f8.data._M_elems[0xb] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems[6] = 0;
        local_f8.data._M_elems[7] = 0;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[0xf]._1_3_ = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_f8,
                   &(pUVar6->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend,
                   &(pUVar7->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
        pnVar3 = (this->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x30);
        *(undefined8 *)puVar1 = local_f8.data._M_elems._48_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_f8.data._M_elems[0xf]._1_3_,local_f8.data._M_elems._56_5_);
        puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x20);
        *(undefined8 *)puVar1 = local_f8.data._M_elems._32_8_;
        *(undefined8 *)(puVar1 + 2) = local_f8.data._M_elems._40_8_;
        puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = local_f8.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_f8.data._M_elems._24_8_;
        *(undefined8 *)&pnVar3[iVar2].m_backend.data = local_f8.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar3[iVar2].m_backend.data + 8) = local_f8.data._M_elems._8_8_;
        pnVar3[iVar2].m_backend.exp = local_f8.exp;
        pnVar3[iVar2].m_backend.neg = local_f8.neg;
        pnVar3[iVar2].m_backend.fpclass = local_f8.fpclass;
        pnVar3[iVar2].m_backend.prec_elem = local_f8.prec_elem;
        if (this->sparsePricingLeave == true) {
          local_f8.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
          local_f8.data._M_elems[1] = local_148.m_backend.data._M_elems[1];
          uVar4 = local_f8.data._M_elems._0_8_;
          local_f8.data._M_elems[2] = local_148.m_backend.data._M_elems[2];
          local_f8.data._M_elems[3] = local_148.m_backend.data._M_elems[3];
          local_f8.data._M_elems[0xc] = local_148.m_backend.data._M_elems[0xc];
          local_f8.data._M_elems[0xd] = local_148.m_backend.data._M_elems[0xd];
          local_f8.data._M_elems._56_5_ = local_148.m_backend.data._M_elems._56_5_;
          local_f8.data._M_elems[0xf]._1_3_ = local_148.m_backend.data._M_elems[0xf]._1_3_;
          local_f8.data._M_elems[8] = local_148.m_backend.data._M_elems[8];
          local_f8.data._M_elems[9] = local_148.m_backend.data._M_elems[9];
          local_f8.data._M_elems[10] = local_148.m_backend.data._M_elems[10];
          local_f8.data._M_elems[0xb] = local_148.m_backend.data._M_elems[0xb];
          local_f8.data._M_elems[4] = local_148.m_backend.data._M_elems[4];
          local_f8.data._M_elems[5] = local_148.m_backend.data._M_elems[5];
          local_f8.data._M_elems[6] = local_148.m_backend.data._M_elems[6];
          local_f8.data._M_elems[7] = local_148.m_backend.data._M_elems[7];
          local_f8.exp = local_148.m_backend.exp;
          local_f8.neg = local_148.m_backend.neg;
          local_f8.fpclass = local_148.m_backend.fpclass;
          local_f8.prec_elem = local_148.m_backend.prec_elem;
          local_f8.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
          if (local_148.m_backend.fpclass != cpp_dec_float_finite || local_f8.data._M_elems[0] != 0)
          {
            local_f8.neg = (bool)(local_148.m_backend.neg ^ 1);
          }
          local_f8.data._M_elems._0_8_ = uVar4;
          tVar5 = boost::multiprecision::operator<
                            ((this->theCoTest).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar2,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_f8);
          if (tVar5) {
            if (this->m_pricingViolUpToDate == true) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&this_00->m_backend,
                         &(this->theCoTest).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
            }
            if ((this->isInfeasible).data[iVar2] == 0) {
              DIdxSet::addIdx(local_a0,iVar2);
              (this->isInfeasible).data[iVar2] = 1;
            }
            goto LAB_00300254;
          }
        }
        if (this->m_pricingViolUpToDate == true) {
          local_f8.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
          local_f8.data._M_elems[1] = local_148.m_backend.data._M_elems[1];
          uVar4 = local_f8.data._M_elems._0_8_;
          local_f8.data._M_elems[2] = local_148.m_backend.data._M_elems[2];
          local_f8.data._M_elems[3] = local_148.m_backend.data._M_elems[3];
          local_f8.data._M_elems[0xc] = local_148.m_backend.data._M_elems[0xc];
          local_f8.data._M_elems[0xd] = local_148.m_backend.data._M_elems[0xd];
          local_f8.data._M_elems._56_5_ = local_148.m_backend.data._M_elems._56_5_;
          local_f8.data._M_elems[0xf]._1_3_ = local_148.m_backend.data._M_elems[0xf]._1_3_;
          local_f8.data._M_elems[8] = local_148.m_backend.data._M_elems[8];
          local_f8.data._M_elems[9] = local_148.m_backend.data._M_elems[9];
          local_f8.data._M_elems[10] = local_148.m_backend.data._M_elems[10];
          local_f8.data._M_elems[0xb] = local_148.m_backend.data._M_elems[0xb];
          local_f8.data._M_elems[4] = local_148.m_backend.data._M_elems[4];
          local_f8.data._M_elems[5] = local_148.m_backend.data._M_elems[5];
          local_f8.data._M_elems[6] = local_148.m_backend.data._M_elems[6];
          local_f8.data._M_elems[7] = local_148.m_backend.data._M_elems[7];
          local_f8.exp = local_148.m_backend.exp;
          local_f8.neg = local_148.m_backend.neg;
          local_f8.fpclass = local_148.m_backend.fpclass;
          local_f8.prec_elem = local_148.m_backend.prec_elem;
          local_f8.data._M_elems[0] = local_148.m_backend.data._M_elems[0];
          if (local_148.m_backend.fpclass != cpp_dec_float_finite || local_f8.data._M_elems[0] != 0)
          {
            local_f8.neg = (bool)(local_148.m_backend.neg ^ 1);
          }
          local_f8.data._M_elems._0_8_ = uVar4;
          tVar5 = boost::multiprecision::operator<
                            ((this->theCoTest).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar2,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_f8);
          if (tVar5) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       &(this->theCoTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
          }
        }
      }
LAB_00300254:
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateFtest()
{
   const IdxSet& idx = theFvec->idx();
   VectorBase<R>& ftest = theCoTest;      // |== fTest()|
   assert(&ftest == &fTest());

   assert(type() == LEAVE);

   updateViols.clear();
   R theeps = entertol();

   for(int j = idx.size() - 1; j >= 0; --j)
   {
      int i = idx.index(j);

      if(m_pricingViolUpToDate && ftest[i] < -theeps)
         // violation was present before this iteration
         m_pricingViol += ftest[i];

      ftest[i] = ((*theFvec)[i] > theUBbound[i])
                 ? theUBbound[i] - (*theFvec)[i]
                 : (*theFvec)[i] - theLBbound[i];

      if(sparsePricingLeave && ftest[i] < -theeps)
      {
         assert(remainingRoundsLeave == 0);

         if(m_pricingViolUpToDate)
            m_pricingViol -= ftest[i];

         if(isInfeasible[i] == SPxPricer<R>::NOT_VIOLATED)
         {
            // this can cause problems - we cannot keep on adding indeces to infeasibilities,
            // because they are not deleted in hyper mode...
            //             if( !hyperPricingLeave )
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
         }

         if(hyperPricingLeave)
            updateViols.addIdx(i);
      }
      else if(m_pricingViolUpToDate && ftest[i] < -theeps)
         m_pricingViol -= ftest[i];
   }

   // if boundflips were performed, we need to update these indices as well
   if(boundflips > 0)
   {
      R eps = epsilon();

      for(int j = 0; j < solveVector3->size(); ++j)
      {
         if(spxAbs(solveVector3->value(j)) > eps)
         {
            int i = solveVector3->index(j);

            if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol += ftest[i];

            ftest[i] = ((*theFvec)[i] > theUBbound[i]) ? theUBbound[i] - (*theFvec)[i] :
                       (*theFvec)[i] - theLBbound[i];

            if(sparsePricingLeave && ftest[i] < -theeps)
            {
               assert(remainingRoundsLeave == 0);

               if(m_pricingViolUpToDate)
                  m_pricingViol -= ftest[i];

               if(!isInfeasible[i])
               {
                  infeasibilities.addIdx(i);
                  isInfeasible[i] = true;
               }
            }
            else if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol -= ftest[i];
         }
      }
   }
}